

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

int __thiscall
pybind11::detail::argument_loader<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>::
call_impl<int,int(*&)(std::__cxx11::string,std::__cxx11::string,std::__cxx11::string),0ul,1ul,2ul,pybind11::detail::void_type>
          (argument_loader<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string> *this,
          undefined8 *f)

{
  code *pcVar1;
  int iVar2;
  string asStack_88 [32];
  string local_68 [32];
  string local_48 [32];
  
  pcVar1 = (code *)*f;
  std::__cxx11::string::string(local_48,(string *)(this + 0x40));
  std::__cxx11::string::string(local_68,(string *)(this + 0x20));
  std::__cxx11::string::string(asStack_88,(string *)this);
  iVar2 = (*pcVar1)(local_48,local_68,asStack_88);
  std::__cxx11::string::~string(asStack_88);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_48);
  return iVar2;
}

Assistant:

Return call_impl(Func &&f, index_sequence<Is...>, Guard &&) && {
        return std::forward<Func>(f)(cast_op<Args>(std::move(std::get<Is>(argcasters)))...);
    }